

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidClipWrongMinMax(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *pAVar5;
  NeuralNetwork *this;
  NeuralNetworkLayer *this_00;
  string *psVar6;
  long lVar7;
  ostream *poVar8;
  undefined1 local_b0 [8];
  Result res1;
  ClipLayerParams *params1;
  NeuralNetworkLayer *layers;
  NeuralNetwork *nn;
  ArrayFeatureType *outShape;
  FeatureDescription *out;
  ArrayFeatureType *inShape;
  FeatureDescription *in;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&in);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"input");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(pFVar3,"output");
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar5 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,3);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar5,2);
  this = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&in);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this,EXACT_ARRAY_MAPPING);
  this_00 = CoreML::Specification::NeuralNetwork::add_layers(this);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  res1.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetworkLayer::mutable_clip(this_00);
  CoreML::Specification::ClipLayerParams::set_minval
            ((ClipLayerParams *)res1.m_message.field_2._8_8_,1.2);
  CoreML::Specification::ClipLayerParams::set_maxval
            ((ClipLayerParams *)res1.m_message.field_2._8_8_,0.4);
  CoreML::validate<(MLModelType)500>((Result *)local_b0,(Model *)&in);
  bVar1 = CoreML::Result::good((Result *)local_b0);
  if (bVar1) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar8 = std::operator<<(poVar8,":");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x15ba);
    poVar8 = std::operator<<(poVar8,": error: ");
    poVar8 = std::operator<<(poVar8,"!((res1).good())");
    poVar8 = std::operator<<(poVar8," was false, expected true.");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  else {
    psVar6 = CoreML::Result::message_abi_cxx11_((Result *)local_b0);
    lVar7 = std::__cxx11::string::find((char *)psVar6,0x4c1cd8);
    if (lVar7 == -1) {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar8 = std::operator<<(poVar8,":");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x15bb);
      poVar8 = std::operator<<(poVar8,": error: ");
      poVar8 = std::operator<<(poVar8,"res1.message().find(\"smaller\") != std::string::npos");
      poVar8 = std::operator<<(poVar8," was false, expected true.");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
    else {
      m._oneof_case_[0] = 0;
    }
  }
  CoreML::Result::~Result((Result *)local_b0);
  CoreML::Specification::Model::~Model((Model *)&in);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidClipWrongMinMax() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // value of minval should be smaller than value of maxval

    auto* params1 = layers->mutable_clip();
    params1->set_minval(1.2f);
    params1->set_maxval(0.4f);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("smaller") != std::string::npos);

    return 0;

}